

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O3

void bf_read_buffer(bfile_t *bfile)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (bfile->progress_cb != (_func_int_float_void_ptr *)0x0) {
    (*bfile->progress_cb)((float)bfile->ipos / (float)bfile->size,bfile->progress_data);
  }
  if ((bfile->ipos != bfile->size) && (uVar2 = (ulong)bfile->buffer_size, uVar2 != 0)) {
    uVar3 = 0;
    do {
      if (bfile->size <= bfile->ipos) {
        return;
      }
      sVar1 = fread(bfile->buffer + uVar3,1,uVar2 - uVar3,(FILE *)bfile->file);
      if (sVar1 == 0) {
        bf_read_buffer_cold_1();
      }
      else {
        uVar3 = uVar3 + sVar1;
        bfile->ipos = bfile->ipos + sVar1;
      }
      uVar2 = (ulong)bfile->buffer_size;
    } while (uVar3 < uVar2);
  }
  return;
}

Assistant:

static
void
bf_read_buffer(
    bfile_t * bfile )
{
    size_t bytes;

    if ( bfile->progress_cb ) {
        bfile->progress_cb( (float)bfile->ipos / (float)bfile->size,
            bfile->progress_data);
    }

    if ( bfile->ipos == bfile->size )
        /* file completely read */
        return;

    bytes = 0;
    while ( (bytes < bfile->buffer_size) && (bfile->ipos < bfile->size) ) {
        size_t b;
        b = fread( bfile->buffer + bytes, 1, bfile->buffer_size - bytes,
                   bfile->file );
        if ( b != 0 ) {
            bytes += b;
            bfile->ipos += b;
        } else {
            fprintf( stderr, "Error: fread() returned 0.\n" );
        }
    }
}